

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

void glu::logShaderProgram
               (TestLog *log,ProgramInfo *programInfo,size_t numShaders,ShaderInfo **shaderInfos)

{
  pointer pcVar1;
  ShaderInfo *pSVar2;
  ProgramInfo *pPVar3;
  byte bVar4;
  size_t sVar5;
  allocator<char> local_112;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  string local_d0;
  ShaderInfo **local_b0;
  TestLog *local_a8;
  bool local_a0;
  undefined7 uStack_9f;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  qpKeyValueTag local_40;
  float local_3c;
  ProgramInfo *local_38;
  
  local_a0 = programInfo->linkOk;
  pcVar1 = (programInfo->infoLog)._M_dataplus._M_p;
  local_98 = local_90._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (programInfo->infoLog)._M_string_length);
  tcu::TestLog::startShaderProgram(log,local_a0,local_98);
  if (local_98 != local_90._M_local_buf + 8) {
    operator_delete(local_98,local_90._8_8_ + 1);
  }
  local_a8 = log;
  local_38 = programInfo;
  if (numShaders == 0) {
    tcu::TestLog::endShaderProgram(log);
LAB_018b3832:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"LinkTime","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Link time","");
    pPVar3 = local_38;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ms","");
    tcu::LogNumber<float>::LogNumber
              ((LogNumber<float> *)&local_a0,&local_f0,&local_d0,&local_110,QP_KEY_TAG_TIME,
               (float)pPVar3->linkTimeUs / 1000.0);
    tcu::TestLog::writeFloat
              (local_a8,(char *)CONCAT71(uStack_9f,local_a0),local_80._M_p,local_60._M_p,local_40,
               local_3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_p != &local_50) {
      operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(uStack_9f,local_a0) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(uStack_9f,local_a0),local_90._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    sVar5 = 0;
    do {
      operator<<(log,shaderInfos[sVar5]);
      sVar5 = sVar5 + 1;
    } while (numShaders != sVar5);
    tcu::TestLog::endShaderProgram(log);
    bVar4 = 1;
    sVar5 = 0;
    local_b0 = shaderInfos;
    do {
      while( true ) {
        pSVar2 = local_b0[sVar5];
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,logShaderProgram::s_compileTimeDesc[pSVar2->type].name,
                   &local_111);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,logShaderProgram::s_compileTimeDesc[pSVar2->type].description
                   ,&local_112);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ms","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&local_a0,&local_f0,&local_d0,&local_110,QP_KEY_TAG_TIME,
                   (float)pSVar2->compileTimeUs / 1000.0);
        tcu::TestLog::writeFloat
                  (local_a8,(char *)CONCAT71(uStack_9f,local_a0),local_80._M_p,local_60._M_p,
                   local_40,local_3c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_p != &local_50) {
          operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_9f,local_a0) != &local_90) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_9f,local_a0),local_90._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((bVar4 & 1) == 0) break;
        bVar4 = pSVar2->compileOk;
        sVar5 = sVar5 + 1;
        if (sVar5 == numShaders) {
          if ((bool)bVar4 == false) {
            return;
          }
          goto LAB_018b3832;
        }
      }
      sVar5 = sVar5 + 1;
      bVar4 = 0;
    } while (sVar5 != numShaders);
  }
  return;
}

Assistant:

static void logShaderProgram (tcu::TestLog& log, const ProgramInfo& programInfo, size_t numShaders, const ShaderInfo* const* shaderInfos)
{
	log << tcu::TestLog::ShaderProgram(programInfo.linkOk, programInfo.infoLog);
	try
	{
		for (size_t shaderNdx = 0; shaderNdx < numShaders; ++shaderNdx)
			log << *shaderInfos[shaderNdx];
	}
	catch (...)
	{
		log << tcu::TestLog::EndShaderProgram;
		throw;
	}
	log << tcu::TestLog::EndShaderProgram;

	// Write statistics.
	{
		static const struct
		{
			const char*		name;
			const char*		description;
		} s_compileTimeDesc[] =
		{
			{ "VertexCompileTime",			"Vertex shader compile time"					},
			{ "FragmentCompileTime",		"Fragment shader compile time"					},
			{ "GeometryCompileTime",		"Geometry shader compile time"					},
			{ "TessControlCompileTime",		"Tesselation control shader compile time"		},
			{ "TessEvaluationCompileTime",	"Tesselation evaluation shader compile time"	},
			{ "ComputeCompileTime",			"Compute shader compile time"					},
		};
		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_compileTimeDesc) == SHADERTYPE_LAST);

		bool allShadersOk = true;

		for (size_t shaderNdx = 0; shaderNdx < numShaders; ++shaderNdx)
		{
			const ShaderInfo&	shaderInfo	= *shaderInfos[shaderNdx];

			log << tcu::TestLog::Float(s_compileTimeDesc[shaderInfo.type].name,
									   s_compileTimeDesc[shaderInfo.type].description,
									   "ms", QP_KEY_TAG_TIME, (float)shaderInfo.compileTimeUs / 1000.0f);

			allShadersOk = allShadersOk && shaderInfo.compileOk;
		}

		if (allShadersOk)
			log << tcu::TestLog::Float("LinkTime", "Link time", "ms", QP_KEY_TAG_TIME, (float)programInfo.linkTimeUs / 1000.0f);
	}
}